

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::SimpleLineCollector::ConsumeLine
          (SimpleLineCollector *this,StringPiece *line,string *out_error)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_40;
  string *local_20;
  string *out_error_local;
  StringPiece *line_local;
  SimpleLineCollector *this_local;
  
  this_00 = this->set_;
  local_20 = out_error;
  out_error_local = (string *)line;
  line_local = (StringPiece *)this;
  stringpiece_internal::StringPiece::operator_cast_to_string(&local_40,line);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

virtual bool ConsumeLine(const StringPiece& line, std::string* out_error) override {
    set_->insert(std::string(line));
    return true;
  }